

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O1

bool duckdb::ApproxQuantileCoding::Decode<double,duckdb::dtime_tz_t>
               (double *source,dtime_tz_t *target)

{
  bool bVar1;
  dtime_tz_t dVar2;
  uint64_t sort_key;
  ulong local_78;
  LogicalType local_70 [24];
  LogicalType local_58 [64];
  
  bVar1 = duckdb::TryCast::Operation<double,unsigned_long>(*source,&local_78,false);
  if (bVar1) {
    target->bits = (ulong)((uint)local_78 & 0xffffff) * -0xf4240000000 + local_78;
  }
  else {
    local_78 = -(ulong)(0.0 <= *source);
    if (0.0 <= *source) {
      duckdb::LogicalType::LogicalType(local_70,TIME_TZ);
      duckdb::Value::MaximumValue(local_58);
      dVar2 = duckdb::Value::GetValue<duckdb::dtime_tz_t>();
    }
    else {
      duckdb::LogicalType::LogicalType(local_70,TIME_TZ);
      duckdb::Value::MinimumValue(local_58);
      dVar2 = duckdb::Value::GetValue<duckdb::dtime_tz_t>();
    }
    target->bits = (uint64_t)dVar2;
    duckdb::Value::~Value((Value *)local_58);
    duckdb::LogicalType::~LogicalType(local_70);
  }
  return bVar1;
}

Assistant:

bool ApproxQuantileCoding::Decode(const double &source, dtime_tz_t &target) {
	uint64_t sort_key;
	const auto decoded = Decode<double, uint64_t>(source, sort_key);
	if (decoded) {
		//	We can invert the sort key because its offset was not touched.
		auto offset = dtime_tz_t::decode_offset(sort_key);
		auto micros = dtime_tz_t::decode_micros(sort_key);
		micros -= int64_t(dtime_tz_t::encode_offset(offset) * dtime_tz_t::OFFSET_MICROS);
		target = dtime_tz_t(dtime_t(micros), offset);
	} else if (source < 0) {
		target = Value::MinimumValue(LogicalTypeId::TIME_TZ).GetValue<dtime_tz_t>();
	} else {
		target = Value::MaximumValue(LogicalTypeId::TIME_TZ).GetValue<dtime_tz_t>();
	}

	return decoded;
}